

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFtpTransfer.cpp
# Opt level: O0

int __thiscall CFtpTransfer::Receive(CFtpTransfer *this,int client_sockfd)

{
  code *pcVar1;
  EFTPSTATE EVar2;
  ssize_t sVar3;
  ostream *poVar4;
  CCommand *pCVar5;
  EFTPSTATE state;
  allocator local_1059;
  string local_1058;
  CCommand *local_1038;
  CCommand *pCommand;
  CClient *pClient;
  char buffer [4096];
  long n;
  int client_sockfd_local;
  CFtpTransfer *this_local;
  
  bzero(&pClient,0x1000);
  sVar3 = ReceiveLine(this,client_sockfd,(char *)&pClient,0x1000);
  if (sVar3 < 1) {
    CManageClient::EarseClient(&this->m_ClientManager,client_sockfd);
    this->m_CurrentConnetions = this->m_CurrentConnetions + -1;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"From client command: ");
    poVar4 = std::operator<<(poVar4,(char *)&pClient);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    pCommand = (CCommand *)CManageClient::FindClient(&this->m_ClientManager,client_sockfd);
    if ((CClient *)pCommand != (CClient *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1058,(char *)&pClient,&local_1059);
      pCVar5 = CManageClient::FindCommand(&this->m_ClientManager,&local_1058);
      std::__cxx11::string::~string((string *)&local_1058);
      std::allocator<char>::~allocator((allocator<char> *)&local_1059);
      local_1038 = pCVar5;
      if (pCVar5 == (CCommand *)0x0) {
        CClient::sendErrorMsg((CClient *)pCommand);
      }
      else {
        (*pCVar5->_vptr_CCommand[1])(pCVar5,pCommand);
        EVar2 = CClient::GetClientState((CClient *)pCommand);
        if (EVar2 == QUIT) {
          CManageClient::EarseClient(&this->m_ClientManager,client_sockfd);
          this->m_CurrentConnetions = this->m_CurrentConnetions + -1;
        }
      }
    }
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int CFtpTransfer::Receive(const int client_sockfd) {
    long int n;
    char buffer[BUFFER_SIZE];
    bzero(buffer,BUFFER_SIZE);
    n = ReceiveLine(client_sockfd,buffer,BUFFER_SIZE);
    if(n > 0){
        cout << "From client command: " << buffer << endl;
        CClient *pClient = m_ClientManager.FindClient(client_sockfd);
        if(pClient){
            CCommand *pCommand = m_ClientManager.FindCommand(string(buffer));
            if(pCommand){
                pCommand->doWhat(pClient);
                EFTPSTATE state = pClient->GetClientState();
                if(state == QUIT){
                    m_ClientManager.EarseClient(client_sockfd);
                    m_CurrentConnetions--;
                    //cout << "one con disconnected and current con is: " << m_CurrentConnetions << endl;
                }
            }
            else{
                pClient->sendErrorMsg();
            }
        }
    }
    else{
        m_ClientManager.EarseClient(client_sockfd);
        m_CurrentConnetions--;
        //cout << "one con disconnected and current con is: " << m_CurrentConnetions << endl;
    }
}